

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::cbtCapsuleBoxCollisionAlgorithm::processCollision
          (cbtCapsuleBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  int iVar3;
  cbtTransform *this_00;
  cbtCollisionShape *this_01;
  cbtCollisionShape *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  cbtCollisionObjectWrapper *pcVar8;
  pointer pfVar9;
  long lVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined8 uVar21;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar22 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar29 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar30 [16];
  cbtVector3 cVar31;
  initializer_list<float> __l;
  float local_178;
  cbtScalar tMin;
  float local_170;
  cbtScalar tMax;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  cbtVector3 local_148;
  float local_130;
  float local_12c;
  cbtManifoldResult *local_128;
  vector<float,_std::allocator<float>_> t_points;
  cbtVector3 c2;
  cbtVector3 v;
  cbtVector3 hdims;
  cbtVector3 c1;
  cbtVector3 a;
  float local_98;
  float fStack_94;
  cbtTransform box_X_cap;
  undefined1 extraout_var [60];
  
  local_148.m_floats._8_8_ = local_148.m_floats._0_8_;
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    bVar7 = this->m_isSwapped;
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    pcVar8 = body1;
    if (bVar7 != false) {
      pcVar8 = body0;
      body0 = body1;
    }
    this_00 = pcVar8->m_worldTransform;
    this_01 = pcVar8->m_shape;
    pcVar4 = body0->m_shape;
    local_128 = resultOut;
    cbtTransform::inverseTimes(&box_X_cap,this_00,body0->m_worldTransform);
    auVar29 = (undefined1  [56])0x0;
    auVar11 = vinsertps_avx((undefined1  [16])box_X_cap.m_basis.m_el._4_16_,
                            ZEXT416((uint)box_X_cap.m_basis.m_el[1].m_floats[1]),0x10);
    a.m_floats = (cbtScalar  [4])
                 vmovlhps_avx(auVar11,ZEXT416((uint)box_X_cap.m_basis.m_el[2].m_floats[1]));
    local_98 = box_X_cap.m_origin.m_floats[0];
    fStack_94 = box_X_cap.m_origin.m_floats[1];
    auVar22 = (undefined1  [56])0x0;
    local_170 = box_X_cap.m_origin.m_floats[2];
    cVar31 = cbtBoxShape::getHalfExtentsWithMargin((cbtBoxShape *)this_01);
    auVar23._0_8_ = cVar31.m_floats._8_8_;
    auVar23._8_56_ = auVar29;
    auVar24._0_8_ = cVar31.m_floats._0_8_;
    auVar24._8_56_ = auVar22;
    hdims.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar24._0_16_,auVar23._0_16_);
    iVar3 = *(int *)((long)&pcVar4[2]._vptr_cbtCollisionShape + 4);
    local_148.m_floats[1] = *(cbtScalar *)(&pcVar4[1].field_0xc + (long)iVar3 * 4);
    auVar24 = ZEXT464((uint)local_148.m_floats[1]);
    fVar1 = *(float *)(&pcVar4[1].field_0xc + (long)((iVar3 + 2) % 3) * 4);
    local_168 = ZEXT416((uint)local_148.m_floats[1]);
    local_12c = (local_148.m_floats[1] + local_148.m_floats[1]) * 0.0001;
    auVar11._8_4_ = 0x80000000;
    auVar11._0_8_ = 0x8000000080000000;
    auVar11._12_4_ = 0x80000000;
    local_158 = vxorps_avx512vl(local_168,auVar11);
    local_148.m_floats[0] = local_158._0_4_;
    __l._M_len = 2;
    __l._M_array = local_148.m_floats;
    std::vector<float,_std::allocator<float>_>::vector(&t_points,__l,(allocator_type *)&v);
    lVar10 = 0;
    while( true ) {
      auVar22 = auVar24._8_56_;
      if (lVar10 == 3) break;
      auVar29 = ZEXT856(0);
      local_148.m_floats = (cbtScalar  [4])ZEXT816(0);
      local_148.m_floats[lVar10] = 1.0;
      cVar31 = cbtVector3::cross(&local_148,&a);
      auVar25._0_8_ = cVar31.m_floats._8_8_;
      auVar25._8_56_ = auVar22;
      auVar15._0_8_ = cVar31.m_floats._0_8_;
      auVar15._8_56_ = auVar29;
      v.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar15._0_16_,auVar25._0_16_);
      auVar24 = ZEXT464(0x3727c5ac);
      auVar5._8_4_ = 0x7fffffff;
      auVar5._0_8_ = 0x7fffffff7fffffff;
      auVar5._12_4_ = 0x7fffffff;
      auVar11 = vandps_avx512vl(ZEXT416((uint)(a.m_floats[lVar10] + -1.0)),auVar5);
      uVar21 = auVar11._8_8_;
      if (1e-05 <= auVar11._0_4_) {
        cVar31 = cbtVector3::cross(&v,&a);
        auVar6._8_8_ = 0;
        auVar6._0_4_ = box_X_cap.m_origin.m_floats[0];
        auVar6._4_4_ = box_X_cap.m_origin.m_floats[1];
        fVar12 = fVar1 * cVar31.m_floats[2];
        auVar13._0_4_ = fVar1 * cVar31.m_floats[0];
        auVar13._4_4_ = fVar1 * cVar31.m_floats[1];
        auVar13._8_4_ = fVar1 * (float)uVar21;
        auVar13._12_4_ = fVar1 * (float)((ulong)uVar21 >> 0x20);
        auVar30._0_4_ = local_98 + auVar13._0_4_;
        auVar30._4_4_ = fStack_94 + auVar13._4_4_;
        auVar30._8_4_ = auVar13._8_4_ + 0.0;
        auVar30._12_4_ = auVar13._12_4_ + 0.0;
        auVar11 = vsubps_avx(auVar6,auVar13);
        c1.m_floats = (cbtScalar  [4])
                      vinsertps_avx(auVar30,ZEXT416((uint)(local_170 + fVar12)),0x28);
        c2.m_floats = (cbtScalar  [4])
                      vinsertps_avx(auVar11,ZEXT416((uint)(local_170 - fVar12)),0x28);
        bVar7 = bt_utils::IntersectSegmentBox
                          (&hdims,&c1,&a,(cbtScalar)local_168._0_4_,1e-05,&tMin,&tMax);
        if (bVar7) {
          auVar11 = vminss_avx(local_168,ZEXT416((uint)tMin));
          uVar21 = vcmpss_avx512f(ZEXT416((uint)tMin),local_158,1);
          bVar7 = (bool)((byte)uVar21 & 1);
          local_178 = (float)((uint)bVar7 * local_158._0_4_ + (uint)!bVar7 * auVar11._0_4_);
          std::vector<float,_std::allocator<float>_>::emplace_back<float>(&t_points,&local_178);
          auVar11 = vminss_avx(local_168,ZEXT416((uint)tMax));
          uVar21 = vcmpss_avx512f(ZEXT416((uint)tMax),local_158,1);
          bVar7 = (bool)((byte)uVar21 & 1);
          local_178 = (float)((uint)bVar7 * local_158._0_4_ + (uint)!bVar7 * auVar11._0_4_);
          std::vector<float,_std::allocator<float>_>::emplace_back<float>(&t_points,&local_178);
        }
        auVar24 = ZEXT464(0x3727c5ac);
        bVar7 = bt_utils::IntersectSegmentBox
                          (&hdims,&c2,&a,(cbtScalar)local_168._0_4_,1e-05,&tMin,&tMax);
        if (bVar7) {
          auVar11 = vminss_avx(local_168,ZEXT416((uint)tMin));
          uVar21 = vcmpss_avx512f(ZEXT416((uint)tMin),local_158,1);
          bVar7 = (bool)((byte)uVar21 & 1);
          local_178 = (float)((uint)bVar7 * local_158._0_4_ + (uint)!bVar7 * auVar11._0_4_);
          std::vector<float,_std::allocator<float>_>::emplace_back<float>(&t_points,&local_178);
          auVar11 = vminss_avx(local_168,ZEXT416((uint)tMax));
          uVar21 = vcmpss_avx512f(ZEXT416((uint)tMax),local_158,1);
          bVar7 = (bool)((byte)uVar21 & 1);
          local_178 = (float)((uint)bVar7 * local_158._0_4_ + (uint)!bVar7 * auVar11._0_4_);
          auVar24 = ZEXT1664(CONCAT124(auVar11._4_12_,local_178));
          std::vector<float,_std::allocator<float>_>::emplace_back<float>(&t_points,&local_178);
        }
      }
      lVar10 = lVar10 + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (t_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               t_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish);
    fVar12 = (float)local_168._0_4_ * -2.0;
    local_130 = fVar1 * fVar1;
    for (pfVar9 = t_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar9 != t_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish; pfVar9 = pfVar9 + 1) {
      fVar2 = *pfVar9;
      if (local_12c <= fVar2 - fVar12) {
        local_168 = ZEXT416((uint)fVar2);
        fVar12 = fVar2 * a.m_floats[2] + local_170;
        local_158._0_4_ = fVar2 * a.m_floats[0] + local_98;
        local_158._4_4_ = fVar2 * a.m_floats[1] + fStack_94;
        local_158._8_4_ = fVar2 * 0.0 + 0.0;
        local_158._12_4_ = fVar2 * 0.0 + 0.0;
        local_148.m_floats = (cbtScalar  [4])vinsertps_avx(local_158,ZEXT416((uint)fVar12),0x28);
        bt_utils::SnapPointToBox(&hdims,&local_148);
        cVar31.m_floats = local_148.m_floats;
        auVar14._8_8_ = 0;
        auVar14._0_4_ = local_148.m_floats[0];
        auVar14._4_4_ = local_148.m_floats[1];
        auVar11 = vsubps_avx(local_158,auVar14);
        local_148.m_floats[2] = cVar31.m_floats[2];
        v.m_floats = (cbtScalar  [4])
                     vinsertps_avx(auVar11,ZEXT416((uint)(fVar12 - local_148.m_floats[2])),0x28);
        local_148.m_floats = cVar31.m_floats;
        auVar16._0_4_ = cbtVector3::length2(&v);
        auVar16._4_60_ = extraout_var;
        fVar12 = (float)local_168._0_4_;
        if (auVar16._0_4_ < local_130) {
          auVar22 = ZEXT856(extraout_var._4_8_);
          if (1e-12 < auVar16._0_4_) {
            if (auVar16._0_4_ < 0.0) {
              auVar22 = ZEXT856(extraout_var._4_8_);
              auVar17._0_4_ = sqrtf(auVar16._0_4_);
              auVar17._4_60_ = extraout_var_00;
            }
            else {
              auVar11 = vsqrtss_avx(auVar16._0_16_,auVar16._0_16_);
              auVar17 = ZEXT1664(auVar11);
            }
            auVar29 = auVar17._8_56_;
            tMin = auVar17._0_4_;
            local_158._0_4_ = tMin;
            cVar31 = ::operator/(&v,&tMin);
            auVar26._0_8_ = cVar31.m_floats._8_8_;
            auVar26._8_56_ = auVar22;
            auVar18._0_8_ = cVar31.m_floats._0_8_;
            auVar18._8_56_ = auVar29;
            c2.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar18._0_16_,auVar26._0_16_);
            auVar29 = ZEXT856(c2.m_floats._8_8_);
            cVar31 = ::operator*(&this_00->m_basis,&c2);
            auVar27._0_8_ = cVar31.m_floats._8_8_;
            auVar27._8_56_ = auVar22;
            auVar19._0_8_ = cVar31.m_floats._0_8_;
            auVar19._8_56_ = auVar29;
            c1.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar19._0_16_,auVar27._0_16_);
            auVar29 = ZEXT856(c1.m_floats._8_8_);
            cVar31 = cbtTransform::operator()(this_00,&local_148);
            auVar28._0_8_ = cVar31.m_floats._8_8_;
            auVar28._8_56_ = auVar22;
            auVar20._0_8_ = cVar31.m_floats._0_8_;
            auVar20._8_56_ = auVar29;
            c2.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar20._0_16_,auVar28._0_16_);
            (*(local_128->super_Result)._vptr_Result[4])
                      ((ulong)(uint)((float)local_158._0_4_ - fVar1),local_128,&c1,&c2);
            fVar12 = (float)local_168._0_4_;
          }
        }
      }
    }
    if ((this->m_ownManifold != false) && (this->m_manifoldPtr->m_cachedPoints != 0)) {
      cbtManifoldResult::refreshContactPoints(local_128);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&t_points.super__Vector_base<float,_std::allocator<float>_>);
  }
  return;
}

Assistant:

void cbtCapsuleBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                       const cbtCollisionObjectWrapper* body1,
                                                       const cbtDispatcherInfo& dispatchInfo,
                                                       cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* capObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* boxObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    const cbtCapsuleShape* cap = (cbtCapsuleShape*)capObjWrap->getCollisionShape();
    const cbtBoxShape* box = (cbtBoxShape*)boxObjWrap->getCollisionShape();

    // Express capsule in the box frame
    const cbtTransform& abs_X_cap = capObjWrap->getWorldTransform();
    const cbtTransform& abs_X_box = boxObjWrap->getWorldTransform();
    cbtTransform box_X_cap = abs_X_box.inverseTimes(abs_X_cap);

    cbtVector3 a = box_X_cap.getBasis().getColumn(1);  // capsule axis (expressed in box frame)
    cbtVector3 c = box_X_cap.getOrigin();              // capsule center (expressed in box frame)

    // Box dimensions
    cbtVector3 hdims = box->getHalfExtentsWithMargin();

    // Cylinder dimensions
    cbtScalar radius = cap->getRadius();    // capsule radius
    cbtScalar hlen = cap->getHalfHeight();  // capsule half-length

    // Loop over each direction of the box frame (i.e., each of the 3 face normals).
    // In each case, consider two segments on the cylindrical surface that are on a plane defined by the axis and the
    // face normal. (Note that, in principle, we could only consider the segment "closest" to the box, but that is not
    // trivial to define in all configurations). Such segments are parameterized by t in [-H,H].
    //
    // Consider (at most) 4 candidate points on each segment: the 2 ends of the segment and the intersections of the
    // segment with the box (if such an intersection exists).
    //
    // For a capsule, projects these points back onto the capsule axis and check intersection between spheres centered
    // at the points on the axis and the box.  In this case, the projection is done orthogonal to the capsule axis.

    const cbtScalar parallel_tol = cbtScalar(1e-5);           // tolearance for parallelism tests
    const cbtScalar near_tol = cbtScalar(1e-4) * (2 * hlen);  // tolerance for line parameters of near duplicate points

    std::vector<cbtScalar> t_points = {-hlen, +hlen};  // initialize list of candidates with segment ends

    for (int i = 0; i < 3; i++) {
        // "positive" face normal
        cbtVector3 n(0, 0, 0);
        n[i] = 1;

        // If the axis is parallel to the face normal, no additional candidate point.
        cbtVector3 v = n.cross(a);
        if (std::abs(a[i] - 1) < parallel_tol)
            continue;

        // Direction perpendicular to axis
        cbtVector3 r = v.cross(a);

        // Construct center points of the two segments on cylindrical surface
        cbtVector3 c1 = c + radius * r;
        cbtVector3 c2 = c - radius * r;

        // Check if either segment intersects box.
        // If it does, append line parameters for intersection points (clamped to segment limits).
        cbtScalar tMin;
        cbtScalar tMax;
        if (bt_utils::IntersectSegmentBox(hdims, c1, a, hlen, parallel_tol, tMin, tMax)) {
            t_points.push_back(ChClamp(tMin, -hlen, +hlen));
            t_points.push_back(ChClamp(tMax, -hlen, +hlen));
        }
        if (bt_utils::IntersectSegmentBox(hdims, c2, a, hlen, parallel_tol, tMin, tMax)) {
            t_points.push_back(ChClamp(tMin, -hlen, +hlen));
            t_points.push_back(ChClamp(tMax, -hlen, +hlen));
        }
    }

    // Contact distance
    cbtScalar contactDist = radius;
    ////cbtScalar contactDist = radius + m_manifoldPtr->getContactBreakingThreshold();

    // Loop over all candidate points (points on the capsule axis) and perform a sphere-box collision test.
    // In order to eliminate near duplicate points, use a sorted list and keep track of last processed point.
    std::sort(t_points.begin(), t_points.end());
    cbtScalar t_last = -2 * hlen;
    int n_contacts = 0;
    for (auto t : t_points) {
        if (t - t_last < near_tol)
            continue;

        // Update last processed point
        t_last = t;

        // Calculate sphere center (point on axis, expressed in box frame) and snap it to the surface of the box
        cbtVector3 sphPos = c + a * t;
        cbtVector3 boxPos = sphPos;
        bt_utils::SnapPointToBox(hdims, boxPos);

        // If the distance from the sphere center to the closest point is larger than the radius plus the separation
        // value, then there is no contact. Also, ignore contact if the sphere center (almost) coincides with the
        // closest point, in which case we couldn't decide on the proper contact direction.
        cbtVector3 delta = sphPos - boxPos;
        cbtScalar dist2 = delta.length2();
        if (dist2 >= contactDist * contactDist || dist2 <= 1e-12)
            continue;

        // Generate contact information (transform to absolute frame)
        cbtScalar dist = cbtSqrt(dist2);
        cbtScalar penetration = dist - radius;
        cbtVector3 normal = abs_X_box.getBasis() * (delta / dist);
        cbtVector3 point = abs_X_box(boxPos);

        // A new contact point must specify:
        //   normal, pointing from B towards A
        //   point, located on surface of B
        //   distance, negative for penetration
        resultOut->addContactPoint(normal, point, penetration);
        n_contacts++;
    }

    if (m_ownManifold && m_manifoldPtr->getNumContacts()) {
        resultOut->refreshContactPoints();
    }
}